

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O0

string * __thiscall
(anonymous_namespace)::ProfileDataChecker::ValidateProfile_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  int iVar1;
  char *pcVar2;
  long *plVar3;
  byte local_251;
  allocator<char> local_14e;
  allocator<char> local_14d;
  int local_14c;
  int local_148;
  int chars_scanned_1;
  int chars_scanned;
  bool found_match;
  char *line_cur;
  char *pcStack_130;
  bool has_leading_space;
  char *line_end;
  char *line_start;
  int local_118;
  allocator<char> local_113;
  allocator<char> local_112;
  allocator<char> local_111;
  int i;
  ssize_t size_this_sample;
  ProfileDataSlot slots_this_sample;
  ProfileDataSlot *sample;
  char *pcStack_f0;
  bool seen_trailer;
  ssize_t cur_offset;
  scoped_array<char> local_e0;
  scoped_array<char> filedata;
  ssize_t filesize;
  undefined1 local_c8 [8];
  stat statbuf;
  allocator<char> local_2d [17];
  FileDescriptor local_1c;
  void *pvStack_18;
  FileDescriptor fd;
  ProfileDataChecker *this_local;
  
  pvStack_18 = this;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = open(pcVar2,0);
  anon_unknown.dwarf_347e::FileDescriptor::FileDescriptor(&local_1c,iVar1);
  iVar1 = anon_unknown.dwarf_347e::FileDescriptor::get(&local_1c);
  if (iVar1 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"file open error",local_2d);
    std::allocator<char>::~allocator(local_2d);
    statbuf.__glibc_reserved[2]._4_4_ = 1;
  }
  else {
    iVar1 = anon_unknown.dwarf_347e::FileDescriptor::get(&local_1c);
    iVar1 = fstat(iVar1,(stat *)local_c8);
    if (iVar1 == 0) {
      filedata.data_ = (char *)statbuf.st_rdev;
      pcVar2 = (char *)operator_new__(statbuf.st_rdev);
      anon_unknown.dwarf_347e::scoped_array<char>::scoped_array(&local_e0,pcVar2);
      iVar1 = anon_unknown.dwarf_347e::FileDescriptor::get(&local_1c);
      pcVar2 = anon_unknown.dwarf_347e::scoped_array<char>::get(&local_e0);
      pcVar2 = (char *)anon_unknown.dwarf_347e::ReadPersistent(iVar1,pcVar2,filedata.data_);
      if (pcVar2 == filedata.data_) {
        if (filedata.data_ < (char *)0x40) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,
                     "not enough data in profile for header + trailer",
                     (allocator<char> *)((long)&cur_offset + 6));
          std::allocator<char>::~allocator((allocator<char> *)((long)&cur_offset + 6));
        }
        else {
          plVar3 = (long *)anon_unknown.dwarf_347e::scoped_array<char>::get(&local_e0);
          if (*plVar3 == 0) {
            pcVar2 = anon_unknown.dwarf_347e::scoped_array<char>::get(&local_e0);
            if (*(long *)(pcVar2 + 8) == 3) {
              pcVar2 = anon_unknown.dwarf_347e::scoped_array<char>::get(&local_e0);
              if (*(long *)(pcVar2 + 0x10) == 0) {
                pcVar2 = anon_unknown.dwarf_347e::scoped_array<char>::get(&local_e0);
                if (*(long *)(pcVar2 + 0x20) == 0) {
                  pcStack_f0 = (char *)0x28;
                  sample._7_1_ = 0;
                  while (((sample._7_1_ ^ 0xff) & 1) != 0) {
                    if (filedata.data_ + -0x18 < pcStack_f0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,"truncated sample header",
                                 (allocator<char> *)((long)&sample + 6));
                      std::allocator<char>::~allocator((allocator<char> *)((long)&sample + 6));
                      goto LAB_0010f64f;
                    }
                    pcVar2 = anon_unknown.dwarf_347e::scoped_array<char>::get(&local_e0);
                    slots_this_sample = (ProfileDataSlot)(pcVar2 + (long)pcStack_f0);
                    size_this_sample = *(long *)(slots_this_sample + 8) + 2;
                    _i = size_this_sample * 8;
                    if ((long)(filedata.data_ + size_this_sample * -8) < (long)pcStack_f0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,"truncated sample",&local_111);
                      std::allocator<char>::~allocator(&local_111);
                      goto LAB_0010f64f;
                    }
                    if (((*(long *)slots_this_sample == 0) &&
                        (*(long *)(slots_this_sample + 8) == 1)) &&
                       (*(long *)(slots_this_sample + 0x10) == 0)) {
                      sample._7_1_ = 1;
                    }
                    else {
                      if (*(long *)slots_this_sample == 0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)__return_storage_ptr__,
                                   "error in sample: sample count < 1",&local_112);
                        std::allocator<char>::~allocator(&local_112);
                        goto LAB_0010f64f;
                      }
                      if (*(long *)(slots_this_sample + 8) == 0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)__return_storage_ptr__,"error in sample: num_pcs < 1",
                                   &local_113);
                        std::allocator<char>::~allocator(&local_113);
                        goto LAB_0010f64f;
                      }
                      for (local_118 = 2; (ulong)(long)local_118 < (ulong)size_this_sample;
                          local_118 = local_118 + 1) {
                        if (*(long *)(slots_this_sample + (long)local_118 * 8) == 0) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)__return_storage_ptr__,"error in sample: NULL PC",
                                     (allocator<char> *)((long)&line_start + 7));
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)((long)&line_start + 7));
                          goto LAB_0010f64f;
                        }
                      }
                    }
                    pcStack_f0 = pcStack_f0 + _i;
                  }
                  if ((long)pcStack_f0 < (long)filedata.data_) {
                    pcVar2 = anon_unknown.dwarf_347e::scoped_array<char>::operator[]
                                       (&local_e0,(int)filedata.data_ + -1);
                    if (*pcVar2 == '\n') {
                      for (; (long)pcStack_f0 < (long)filedata.data_;
                          pcStack_f0 = pcStack_f0 + (long)(pcStack_130 + (1 - (long)line_end))) {
                        pcVar2 = anon_unknown.dwarf_347e::scoped_array<char>::get(&local_e0);
                        line_end = pcVar2 + (long)pcStack_f0;
                        pcStack_130 = strchr(line_end,10);
                        *pcStack_130 = '\0';
                        line_cur._7_1_ = 0;
                        for (_chars_scanned = line_end; *_chars_scanned == ' ';
                            _chars_scanned = _chars_scanned + 1) {
                          line_cur._7_1_ = 1;
                        }
                        chars_scanned_1._3_1_ = 0;
                        iVar1 = strncmp(_chars_scanned,"build=",6);
                        chars_scanned_1._3_1_ = iVar1 == 0;
                        if (!(bool)chars_scanned_1._3_1_) {
                          local_148 = -1;
                          __isoc99_sscanf(_chars_scanned,"%*x-%*x %*c%*c%*c%*c %*x %*x:%*x %*d %n",
                                          &local_148);
                          local_251 = 0;
                          if (0 < local_148) {
                            local_251 = line_cur._7_1_ ^ 0xff;
                          }
                          chars_scanned_1._3_1_ = local_251 & 1;
                        }
                        if ((bool)chars_scanned_1._3_1_ == false) {
                          local_14c = -1;
                          __isoc99_sscanf(_chars_scanned,"%*x-%*x: %n",&local_14c);
                          chars_scanned_1._3_1_ = 0 < local_14c;
                        }
                        if ((bool)chars_scanned_1._3_1_ == false) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)__return_storage_ptr__,
                                     "unrecognized line in text section",&local_14d);
                          std::allocator<char>::~allocator(&local_14d);
                          goto LAB_0010f64f;
                        }
                      }
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,"",&local_14e);
                      std::allocator<char>::~allocator(&local_14e);
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,
                                 "profile did not end with a complete line",
                                 (allocator<char> *)((long)&line_start + 5));
                      std::allocator<char>::~allocator((allocator<char> *)((long)&line_start + 5));
                    }
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,"no list of mapped objects",
                               (allocator<char> *)((long)&line_start + 6));
                    std::allocator<char>::~allocator((allocator<char> *)((long)&line_start + 6));
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)__return_storage_ptr__,
                             "error in header: non-zero padding value",
                             (allocator<char> *)((long)&cur_offset + 2));
                  std::allocator<char>::~allocator((allocator<char> *)((long)&cur_offset + 2));
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,
                           "error in header: non-zero format version",
                           (allocator<char> *)((long)&cur_offset + 3));
                std::allocator<char>::~allocator((allocator<char> *)((long)&cur_offset + 3));
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"error in header: num_slots != 3",
                         (allocator<char> *)((long)&cur_offset + 4));
              std::allocator<char>::~allocator((allocator<char> *)((long)&cur_offset + 4));
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"error in header: non-zero count",
                       (allocator<char> *)((long)&cur_offset + 5));
            std::allocator<char>::~allocator((allocator<char> *)((long)&cur_offset + 5));
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"read of whole file failed",
                   (allocator<char> *)((long)&cur_offset + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&cur_offset + 7));
      }
LAB_0010f64f:
      statbuf.__glibc_reserved[2]._4_4_ = 1;
      anon_unknown.dwarf_347e::scoped_array<char>::~scoped_array(&local_e0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"fstat error",
                 (allocator<char> *)((long)&filesize + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&filesize + 7));
      statbuf.__glibc_reserved[2]._4_4_ = 1;
    }
  }
  anon_unknown.dwarf_347e::FileDescriptor::~FileDescriptor(&local_1c);
  return __return_storage_ptr__;
}

Assistant:

std::string ProfileDataChecker::ValidateProfile() {
  FileDescriptor fd(open(filename_.c_str(), O_RDONLY));
  if (fd.get() < 0)
    return "file open error";

  struct stat statbuf;
  if (fstat(fd.get(), &statbuf) != 0)
    return "fstat error";
  if (statbuf.st_size != static_cast<ssize_t>(statbuf.st_size))
    return "file impossibly large";
  ssize_t filesize = statbuf.st_size;

  scoped_array<char> filedata(new char[filesize]);
  if (ReadPersistent(fd.get(), filedata.get(), filesize) != filesize)
    return "read of whole file failed";

  // Must have enough data for the header and the trailer.
  if (filesize < (5 + 3) * sizeof(ProfileDataSlot))
    return "not enough data in profile for header + trailer";

  // Check the header
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[0] != 0)
    return "error in header: non-zero count";
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[1] != 3)
    return "error in header: num_slots != 3";
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[2] != 0)
    return "error in header: non-zero format version";
  // Period (slot 3) can have any value.
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[4] != 0)
    return "error in header: non-zero padding value";
  ssize_t cur_offset = 5 * sizeof(ProfileDataSlot);

  // While there are samples, skip them.  Each sample consists of
  // at least three slots.
  bool seen_trailer = false;
  while (!seen_trailer) {
    if (cur_offset > filesize - 3 * sizeof(ProfileDataSlot))
      return "truncated sample header";
    ProfileDataSlot* sample =
        reinterpret_cast<ProfileDataSlot*>(filedata.get() + cur_offset);
    ProfileDataSlot slots_this_sample = 2 + sample[1];
    ssize_t size_this_sample = slots_this_sample * sizeof(ProfileDataSlot);
    if (cur_offset > filesize - size_this_sample)
      return "truncated sample";

    if (sample[0] == 0 && sample[1] == 1 && sample[2] == 0) {
      seen_trailer = true;
    } else {
      if (sample[0] < 1)
        return "error in sample: sample count < 1";
      if (sample[1] < 1)
        return "error in sample: num_pcs < 1";
      for (int i = 2; i < slots_this_sample; i++) {
        if (sample[i] == 0)
          return "error in sample: NULL PC";
      }
    }
    cur_offset += size_this_sample;
  }

  // There must be at least one line in the (text) list of mapped objects,
  // and it must be terminated by a newline.  Note, the use of newline
  // here and below Might not be reasonable on non-UNIX systems.
  if (cur_offset >= filesize)
    return "no list of mapped objects";
  if (filedata[filesize - 1] != '\n')
    return "profile did not end with a complete line";

  while (cur_offset < filesize) {
    char* line_start = filedata.get() + cur_offset;

    // Find the end of the line, and replace it with a NUL for easier
    // scanning.
    char* line_end = strchr(line_start, '\n');
    *line_end = '\0';

    // Advance past any leading space.  It's allowed in some lines,
    // but not in others.
    bool has_leading_space = false;
    char* line_cur = line_start;
    while (*line_cur == ' ') {
      has_leading_space = true;
      line_cur++;
    }

    bool found_match = false;

    // Check for build lines.
    if (!found_match) {
      found_match = (strncmp(line_cur, "build=", 6) == 0);
      // Anything may follow "build=", and leading space is allowed.
    }

    // A line from ProcMapsIterator::FormatLine, of the form:
    //
    // 40000000-40015000 r-xp 00000000 03:01 12845071   /lib/ld-2.3.2.so
    //
    // Leading space is not allowed.  The filename may be omitted or
    // may consist of multiple words, so we scan only up to the
    // space before the filename.
    if (!found_match) {
      int chars_scanned = -1;
      sscanf(line_cur, "%*x-%*x %*c%*c%*c%*c %*x %*x:%*x %*d %n",
             &chars_scanned);
      found_match = (chars_scanned > 0 && !has_leading_space);
    }

    // A line from DumpAddressMap, of the form:
    //
    // 40000000-40015000: /lib/ld-2.3.2.so
    //
    // Leading space is allowed.  The filename may be omitted or may
    // consist of multiple words, so we scan only up to the space
    // before the filename.
    if (!found_match) {
      int chars_scanned = -1;
      sscanf(line_cur, "%*x-%*x: %n", &chars_scanned);
      found_match = (chars_scanned > 0);
    }

    if (!found_match)
      return "unrecognized line in text section";

    cur_offset += (line_end - line_start) + 1;
  }

  return kNoError;
}